

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

uint32_t __thiscall booster::locale::gnu_gettext::mo_file::get(mo_file *this,uint offset)

{
  uint uVar1;
  uint uVar2;
  runtime_error *this_00;
  allocator local_39;
  string local_38;
  
  if ((ulong)offset <= this->file_size_ - 4) {
    uVar1 = *(uint *)(this->data_ + offset);
    uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (this->native_byteorder_ != false) {
      uVar2 = uVar1;
    }
    return uVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"Bad mo-file format",&local_39);
  runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

uint32_t get(unsigned offset) const
                {
                    uint32_t tmp;
                    if(offset > file_size_ - 4) {
                        throw booster::runtime_error("Bad mo-file format");
                    }
                    memcpy(&tmp,data_ + offset,4);
                    convert(tmp);
                    return tmp;
                }